

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemv.hpp
# Opt level: O2

void remora::bindings::
     gemv_impl<remora::vector<double,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>>
               (double alpha,long *A,undefined8 *x,undefined8 result)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  pdVar3 = (double *)*x;
  lVar1 = x[1];
  lVar2 = x[2];
  for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
    local_40 = A[1];
    local_48 = A[3] * lVar4 * 8 + *A;
    local_38 = 1;
    vector_assign_functor<remora::vector<double,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::dense_tag,remora::cpu_tag>,remora::device_traits<remora::cpu_tag>::multiply_and_add<double>>
              (*pdVar3 * alpha,result,&local_48);
    pdVar3 = pdVar3 + lVar2;
  }
  return;
}

Assistant:

void gemv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> const& x,
	vector_expression<ResultV, cpu_tag>& result,
	typename ResultV::value_type alpha,
	column_major
) {
	typedef typename V::const_iterator iterator;
	typedef typename ResultV::value_type value_type;
	typedef device_traits<cpu_tag>::multiply_and_add<value_type> MultAdd;
	iterator end = x().end();
	for(iterator it = x().begin(); it != end; ++it) {
		//FIXME: for sparse result vectors, this might hurt.
		kernels::assign(result, column(A,it.index()), MultAdd(alpha * (*it)));
	}
}